

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

__m256i * highbd_clamp_epi16(__m256i u,__m256i zero,__m256i max)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i *in_RAX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = in_XMM2_Qa;
  auVar1._16_8_ = in_YMM2_H;
  auVar1._24_8_ = in_register_00001298;
  auVar1 = vpminsw_avx2(auVar3,auVar1);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar2._16_8_ = in_YMM1_H;
  auVar2._24_8_ = in_register_00001258;
  vpmaxsw_avx2(auVar1,auVar2);
  return in_RAX;
}

Assistant:

static inline __m128i highbd_clamp_epi16(__m128i u, int bd) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i max = _mm_sub_epi16(_mm_slli_epi16(one, bd), one);
  __m128i clamped, mask;

  mask = _mm_cmpgt_epi16(u, max);
  clamped = _mm_andnot_si128(mask, u);
  mask = _mm_and_si128(mask, max);
  clamped = _mm_or_si128(mask, clamped);
  mask = _mm_cmpgt_epi16(clamped, zero);
  clamped = _mm_and_si128(clamped, mask);

  return clamped;
}